

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTimeScale(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  int iVar4;
  double dVar5;
  float local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_3c = 0.01;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Th"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
          Abc_NtkTimeScale(pNtk,local_3c);
          return 0;
        }
        pcVar3 = "Timing manager is not defined.\n";
      }
      iVar4 = -1;
      goto LAB_00201d24;
    }
    if (iVar2 != 0x54) goto LAB_00201cbd;
    if (argc <= globalUtilOptind) break;
    dVar5 = atof(argv[globalUtilOptind]);
    local_3c = (float)dVar5;
    globalUtilOptind = iVar4 + 1;
    if (local_3c < 0.0) {
LAB_00201cbd:
      iVar4 = -2;
      Abc_Print(-2,"usage: timescale [-T float] [-vh]\n");
      Abc_Print(-2,"\t           scales timing information of the current network\n");
      Abc_Print(-2,"\t-T float : multiplicative factor [default = %f]\n",(double)local_3c);
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar3);
      pcVar3 = "\t-h       : print the command usage\n";
LAB_00201d24:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-T\" should be followed by a positive integer.\n");
  goto LAB_00201cbd;
}

Assistant:

int Abc_CommandTimeScale( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkTimeScale( Abc_Ntk_t * pNtk, float Scale );
    Abc_Ntk_t * pNtk;
    float nTimeScale;
    int c, fVerbose;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nTimeScale = (float)0.01;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Th" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nTimeScale = atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeScale < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pNtk->pManTime == NULL )
    {
        Abc_Print( -1, "Timing manager is not defined.\n" );
        return 1;
    }
    Abc_NtkTimeScale( pNtk, nTimeScale );
    return 0;

usage:
    Abc_Print( -2, "usage: timescale [-T float] [-vh]\n" );
    Abc_Print( -2, "\t           scales timing information of the current network\n" );
    Abc_Print( -2, "\t-T float : multiplicative factor [default = %f]\n", nTimeScale );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}